

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LayerShapeConstraints.cpp
# Opt level: O0

ShapeRange * __thiscall
CoreML::ShapeRange::operator/(ShapeRange *__return_storage_ptr__,ShapeRange *this,int val)

{
  ostream *poVar1;
  runtime_error *this_00;
  string local_1d0 [48];
  stringstream local_1a0 [8];
  stringstream ss;
  ostream local_190 [380];
  int local_14;
  ShapeRange *pSStack_10;
  int val_local;
  ShapeRange *this_local;
  
  local_14 = val;
  pSStack_10 = this;
  if (val < 1) {
    std::__cxx11::stringstream::stringstream(local_1a0);
    poVar1 = std::operator<<(local_190,"Dividing ShapeRange ");
    poVar1 = ::operator<<(poVar1,this);
    poVar1 = std::operator<<(poVar1," by negative or zero value ");
    std::ostream::operator<<(poVar1,local_14);
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringstream::str();
    std::runtime_error::runtime_error(this_00,local_1d0);
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  operator/(__return_storage_ptr__,this,(long)val);
  return __return_storage_ptr__;
}

Assistant:

ShapeRange ShapeRange::operator/ (int val) const {
    if (val <= 0) {
        std::stringstream ss;
        ss << "Dividing ShapeRange " << *this << " by negative or zero value " << val;
        throw std::runtime_error(ss.str());
    }
    else {
        return (*this)/(static_cast<size_t>(val));
    }
}